

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

Box * __thiscall amrex::BoxList::minimalBox(Box *__return_storage_ptr__,BoxList *this)

{
  pointer pBVar1;
  uint uVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer b;
  const_iterator End;
  
  uVar2 = (this->btype).itype;
  (__return_storage_ptr__->smallend).vect[0] = 1;
  (__return_storage_ptr__->smallend).vect[1] = 1;
  (__return_storage_ptr__->smallend).vect[2] = 1;
  (__return_storage_ptr__->bigend).vect[0] = 0;
  (__return_storage_ptr__->bigend).vect[1] = 0;
  (__return_storage_ptr__->bigend).vect[2] = 0;
  (__return_storage_ptr__->btype).itype = uVar2;
  b = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start;
  pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (b != pBVar3) {
    uVar4 = *(undefined8 *)(b->smallend).vect;
    uVar5 = *(undefined8 *)((b->smallend).vect + 2);
    uVar6 = *(undefined8 *)((b->bigend).vect + 2);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(b->bigend).vect;
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar6;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar4;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar5;
    do {
      pBVar1 = b + 1;
      Box::minBox(__return_storage_ptr__,b);
      b = pBVar1;
    } while (pBVar1 != pBVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Box
BoxList::minimalBox () const
{
    Box minbox(IntVect::TheUnitVector(), IntVect::TheZeroVector(), ixType());
    if ( !isEmpty() )
    {
        const_iterator bli = begin(), End = end();
        minbox = *bli;
        while ( bli != End )
        {
            minbox.minBox(*bli++);
        }
    }
    return minbox;
}